

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

Gia_Man_t * Gia_ManSpecReduceInit(Gia_Man_t *p,Abc_Cex_t *pInit,int nFrames,int fDualOut)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  Vec_Int_t *vXorLits;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  Gia_Man_t *pGVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  char *pcVar18;
  int iVar19;
  ulong uVar20;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    pcVar18 = "Gia_ManSpecReduceInit(): Equivalence classes are not available.\n";
  }
  else {
    iVar14 = p->nRegs;
    if (iVar14 == 0) {
      pcVar18 = "Gia_ManSpecReduceInit(): Circuit is not sequential.\n";
    }
    else if (iVar14 == pInit->nRegs) {
      if ((fDualOut == 0) || ((p->vCos->nSize - iVar14 & 1U) == 0)) {
        if (pInit->nPis != 0) {
          __assert_fail("pInit->nRegs == Gia_ManRegNum(p) && pInit->nPis == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x553,
                        "Gia_Man_t *Gia_ManSpecReduceInit(Gia_Man_t *, Abc_Cex_t *, int, int)");
        }
        uVar20 = (long)nFrames * (long)p->nObjs;
        iVar14 = (int)uVar20;
        if ((p->vCopies).nCap < iVar14) {
          piVar7 = (p->vCopies).pArray;
          if (piVar7 == (int *)0x0) {
            piVar7 = (int *)malloc(uVar20 * 4);
          }
          else {
            piVar7 = (int *)realloc(piVar7,uVar20 * 4);
          }
          (p->vCopies).pArray = piVar7;
          if (piVar7 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          (p->vCopies).nCap = iVar14;
        }
        if (0 < iVar14) {
          memset((p->vCopies).pArray,0xff,(uVar20 & 0xffffffff) << 2);
        }
        (p->vCopies).nSize = iVar14;
        vXorLits = (Vec_Int_t *)malloc(0x10);
        vXorLits->nCap = 1000;
        vXorLits->nSize = 0;
        piVar7 = (int *)malloc(4000);
        vXorLits->pArray = piVar7;
        Gia_ManSetPhase(p);
        if (fDualOut != 0) {
          Gia_ManEquivSetColors(p,0);
        }
        p_00 = Gia_ManStart(p->nObjs * nFrames);
        pcVar18 = p->pName;
        if (pcVar18 == (char *)0x0) {
          pcVar9 = (char *)0x0;
        }
        else {
          sVar8 = strlen(pcVar18);
          pcVar9 = (char *)malloc(sVar8 + 1);
          strcpy(pcVar9,pcVar18);
        }
        p_00->pName = pcVar9;
        pcVar18 = p->pSpec;
        if (pcVar18 == (char *)0x0) {
          pcVar9 = (char *)0x0;
        }
        else {
          sVar8 = strlen(pcVar18);
          pcVar9 = (char *)malloc(sVar8 + 1);
          strcpy(pcVar9,pcVar18);
        }
        p_00->pSpec = pcVar9;
        Gia_ManHashAlloc(p_00);
        iVar14 = p->nRegs;
        if (0 < iVar14) {
          pVVar11 = p->vCis;
          uVar13 = 0;
          do {
            iVar19 = pVVar11->nSize;
            uVar17 = (iVar19 - iVar14) + uVar13;
            if (((int)uVar17 < 0) || (iVar19 <= (int)uVar17)) {
LAB_00200cb8:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar14 = pVVar11->pArray[uVar17];
            if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) {
LAB_00200c99:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            if ((p->vCopies).nSize <= iVar14) goto LAB_00200cd7;
            (p->vCopies).pArray[iVar14] =
                 (uint)(((uint)(&pInit[1].iPo)[uVar13 >> 5] >> (uVar13 & 0x1f) & 1) != 0);
            uVar13 = uVar13 + 1;
            iVar14 = p->nRegs;
          } while ((int)uVar13 < iVar14);
        }
        if (nFrames < 1) {
LAB_00200bf3:
          iVar14 = vXorLits->nSize;
          if (0 < iVar14) {
            lVar16 = 0;
            do {
              Gia_ManAppendCo(p_00,vXorLits->pArray[lVar16]);
              lVar16 = lVar16 + 1;
              iVar14 = vXorLits->nSize;
            } while (lVar16 < iVar14);
          }
          if (iVar14 == 0) {
            Gia_ManAppendCo(p_00,0);
          }
          piVar7 = (p->vCopies).pArray;
          if (piVar7 != (int *)0x0) {
            free(piVar7);
            (p->vCopies).pArray = (int *)0x0;
          }
          (p->vCopies).nCap = 0;
          (p->vCopies).nSize = 0;
          if (vXorLits->pArray != (int *)0x0) {
            free(vXorLits->pArray);
            vXorLits->pArray = (int *)0x0;
          }
          free(vXorLits);
          Gia_ManHashStop(p_00);
          pGVar12 = Gia_ManCleanup(p_00);
          Gia_ManStop(p_00);
          return pGVar12;
        }
        iVar14 = p->nObjs;
        if (0 < iVar14) {
          iVar19 = 0;
          do {
            if ((p->vCopies).nSize <= iVar14 * iVar19) {
LAB_00200cd7:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            (p->vCopies).pArray[(uint)(iVar14 * iVar19)] = 0;
            pVVar11 = p->vCis;
            uVar20 = (ulong)(uint)pVVar11->nSize;
            if (p->nRegs < pVVar11->nSize) {
              lVar16 = 0;
              do {
                if ((int)uVar20 <= lVar16) goto LAB_00200cb8;
                iVar14 = pVVar11->pArray[lVar16];
                if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_00200c99;
                pGVar4 = p->pObjs;
                if (pGVar4 == (Gia_Obj_t *)0x0) break;
                pGVar10 = Gia_ManAppendObj(p_00);
                uVar20 = *(ulong *)pGVar10;
                *(ulong *)pGVar10 = uVar20 | 0x9fffffff;
                *(ulong *)pGVar10 =
                     uVar20 & 0xe0000000ffffffff | 0x9fffffff |
                     (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
                pGVar5 = p_00->pObjs;
                if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00200bd4;
                Vec_IntPush(p_00->vCis,
                            (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
                pGVar5 = p_00->pObjs;
                if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00200bd4;
                pGVar4 = pGVar4 + iVar14;
                pGVar6 = p->pObjs;
                if ((pGVar4 < pGVar6) || (pGVar6 + p->nObjs <= pGVar4)) goto LAB_00200bd4;
                uVar13 = (int)((ulong)((long)pGVar4 - (long)pGVar6) >> 2) * -0x55555555 +
                         p->nObjs * iVar19;
                if (((int)uVar13 < 0) || ((p->vCopies).nSize <= (int)uVar13)) goto LAB_00200cd7;
                (p->vCopies).pArray[uVar13] =
                     (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
                lVar16 = lVar16 + 1;
                pVVar11 = p->vCis;
                uVar20 = (ulong)pVVar11->nSize;
              } while (lVar16 < (long)(uVar20 - (long)p->nRegs));
            }
            iVar14 = p->nRegs;
            if (0 < iVar14) {
              iVar15 = 0;
              do {
                iVar1 = p->vCis->nSize;
                uVar13 = (iVar1 - iVar14) + iVar15;
                if (((int)uVar13 < 0) || (iVar1 <= (int)uVar13)) goto LAB_00200cb8;
                iVar14 = p->vCis->pArray[uVar13];
                if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_00200c99;
                if (p->pObjs == (Gia_Obj_t *)0x0) break;
                Gia_ManSpecBuildInit(p_00,p,p->pObjs + iVar14,vXorLits,iVar19,fDualOut);
                iVar15 = iVar15 + 1;
                iVar14 = p->nRegs;
              } while (iVar15 < iVar14);
            }
            pVVar11 = p->vCos;
            if (0 < pVVar11->nSize) {
              lVar16 = 0;
              do {
                iVar14 = pVVar11->pArray[lVar16];
                if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_00200c99;
                if (p->pObjs == (Gia_Obj_t *)0x0) break;
                pGVar4 = p->pObjs + iVar14;
                Gia_ManSpecReduceInit_rec
                          (p_00,p,pGVar4 + -(*(ulong *)pGVar4 & 0x1fffffff),vXorLits,iVar19,fDualOut
                          );
                pGVar10 = pGVar4 + -(*(ulong *)pGVar4 & 0x1fffffff);
                pGVar5 = p->pObjs;
                if (pGVar10 < pGVar5) goto LAB_00200bd4;
                if (pGVar5 + p->nObjs <= pGVar10) goto LAB_00200bd4;
                iVar14 = p->nObjs * iVar19;
                uVar13 = (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555 + iVar14;
                if (((int)uVar13 < 0) || (iVar15 = (p->vCopies).nSize, iVar15 <= (int)uVar13))
                goto LAB_00200cb8;
                piVar7 = (p->vCopies).pArray;
                uVar13 = piVar7[uVar13];
                if ((int)uVar13 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                ,0x132,"int Abc_LitNotCond(int, int)");
                }
                if ((pGVar4 < pGVar5) || (pGVar5 + p->nObjs <= pGVar4)) goto LAB_00200bd4;
                uVar17 = iVar14 + (int)((ulong)((long)pGVar4 - (long)pGVar5) >> 2) * -0x55555555;
                if (((int)uVar17 < 0) || (iVar15 <= (int)uVar17)) goto LAB_00200cd7;
                piVar7[uVar17] = uVar13 ^ (uint)(*(ulong *)pGVar4 >> 0x1d) & 1;
                lVar16 = lVar16 + 1;
                pVVar11 = p->vCos;
              } while (lVar16 < pVVar11->nSize);
            }
            if (iVar19 == nFrames + -1) goto LAB_00200bf3;
            iVar14 = p->nRegs;
            if (0 < iVar14) {
              iVar15 = 0;
              do {
                uVar13 = (pVVar11->nSize - iVar14) + iVar15;
                if (((int)uVar13 < 0) || (pVVar11->nSize <= (int)uVar13)) goto LAB_00200cb8;
                iVar1 = pVVar11->pArray[uVar13];
                if ((iVar1 < 0) || (iVar2 = p->nObjs, iVar2 <= iVar1)) goto LAB_00200c99;
                if (p->pObjs == (Gia_Obj_t *)0x0) break;
                iVar3 = p->vCis->nSize;
                uVar13 = (iVar3 - iVar14) + iVar15;
                if (((int)uVar13 < 0) || (iVar3 <= (int)uVar13)) goto LAB_00200cb8;
                iVar14 = p->vCis->pArray[uVar13];
                if ((iVar14 < 0) || (iVar2 <= iVar14)) goto LAB_00200c99;
                uVar13 = iVar2 * iVar19 + iVar1;
                if (((int)uVar13 < 0) || (iVar1 = (p->vCopies).nSize, iVar1 <= (int)uVar13))
                goto LAB_00200cb8;
                uVar17 = iVar14 + iVar2 * (iVar19 + 1);
                if (((int)uVar17 < 0) || (iVar1 <= (int)uVar17)) goto LAB_00200cd7;
                piVar7 = (p->vCopies).pArray;
                piVar7[uVar17] = piVar7[uVar13];
                iVar15 = iVar15 + 1;
                iVar14 = p->nRegs;
              } while (iVar15 < iVar14);
            }
            iVar19 = iVar19 + 1;
            iVar14 = p->nObjs;
          } while (0 < iVar14);
        }
LAB_00200bd4:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      pcVar18 = "Gia_ManSpecReduceInit(): Dual-output miter should have even number of POs.\n";
    }
    else {
      pcVar18 = "Gia_ManSpecReduceInit(): Mismatch in the number of registers.\n";
    }
  }
  Abc_Print(1,pcVar18);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManSpecReduceInit( Gia_Man_t * p, Abc_Cex_t * pInit, int nFrames, int fDualOut )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    Vec_Int_t * vXorLits;
    int f, i, iLitNew;
    if ( !p->pReprs )
    {
        Abc_Print( 1, "Gia_ManSpecReduceInit(): Equivalence classes are not available.\n" );
        return NULL;
    }
    if ( Gia_ManRegNum(p) == 0 )
    {
        Abc_Print( 1, "Gia_ManSpecReduceInit(): Circuit is not sequential.\n" );
        return NULL;
    }
    if ( Gia_ManRegNum(p) != pInit->nRegs )
    {
        Abc_Print( 1, "Gia_ManSpecReduceInit(): Mismatch in the number of registers.\n" );
        return NULL;
    }
    if ( fDualOut && (Gia_ManPoNum(p) & 1) )
    {
        Abc_Print( 1, "Gia_ManSpecReduceInit(): Dual-output miter should have even number of POs.\n" );
        return NULL;
    }

/*
    if ( !Gia_ManCheckTopoOrder( p ) )
    {
        Abc_Print( 1, "Gia_ManSpecReduceInit(): AIG is not in a correct topological order.\n" );
        return NULL;
    }
*/
    assert( pInit->nRegs == Gia_ManRegNum(p) && pInit->nPis == 0 );
    Vec_IntFill( &p->vCopies, nFrames * Gia_ManObjNum(p), -1 );
    vXorLits = Vec_IntAlloc( 1000 );
    Gia_ManSetPhase( p );
    if ( fDualOut )
        Gia_ManEquivSetColors( p, 0 );
    pNew = Gia_ManStart( nFrames * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachRo( p, pObj, i )
        Gia_ObjSetCopyF( p, 0, pObj, Abc_InfoHasBit(pInit->pData, i) );
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ObjSetCopyF( p, f, Gia_ManConst0(p), 0 );
        Gia_ManForEachPi( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManAppendCi(pNew) );
        Gia_ManForEachRo( p, pObj, i )
            Gia_ManSpecBuildInit( pNew, p, pObj, vXorLits, f, fDualOut );
        Gia_ManForEachCo( p, pObj, i )
        {
            Gia_ManSpecReduceInit_rec( pNew, p, Gia_ObjFanin0(pObj), vXorLits, f, fDualOut );
            Gia_ObjSetCopyF( p, f, pObj, Gia_ObjFanin0CopyF(p, f, pObj) );
        }
        if ( f == nFrames - 1 )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
            Gia_ObjSetCopyF( p, f+1, pObjRo, Gia_ObjCopyF(p, f, pObjRi) );
    }
    Vec_IntForEachEntry( vXorLits, iLitNew, i )
        Gia_ManAppendCo( pNew, iLitNew );
    if ( Vec_IntSize(vXorLits) == 0 )
    {
//        Abc_Print( 1, "Speculatively reduced model has no primary outputs.\n" );
        Gia_ManAppendCo( pNew, 0 );
    }
    Vec_IntErase( &p->vCopies );
    Vec_IntFree( vXorLits );
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}